

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O2

void __thiscall
RigidBodyDynamics::Errors::RBDLFileParseError::~RBDLFileParseError(RBDLFileParseError *this)

{
  RBDLError::~RBDLError(&this->super_RBDLError);
  operator_delete(this,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLFileParseError : public RBDLError
{
public:
  RBDLFileParseError(std::string text);
}